

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O1

int ERKStepReInit(void *arkode_mem,ARKRhsFn f,realtype t0,N_Vector y0)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeERKStepMem local_40;
  ARKodeMem local_38;
  
  iVar1 = erkStep_AccessStepMem(arkode_mem,"ERKStepReInit",&local_38,&local_40);
  if (iVar1 == 0) {
    if (local_38->MallocDone == 0) {
      msgfmt = "Attempt to call before ARKodeInit.";
      iVar1 = -0x17;
      error_code = -0x17;
    }
    else {
      if (f == (ARKRhsFn)0x0) {
        msgfmt = "Must specify at least one of fe, fi (both NULL).";
      }
      else {
        if (y0 != (N_Vector)0x0) {
          local_40->f = f;
          iVar1 = arkInit((ARKodeMem)arkode_mem,t0,y0,0);
          if (iVar1 != 0) {
            arkProcessError(local_38,iVar1,"ARKode::ERKStep","ERKStepReInit",
                            "Unable to initialize main ARKode infrastructure");
            return iVar1;
          }
          local_40->nfe = 0;
          return 0;
        }
        msgfmt = "y0 = NULL illegal.";
      }
      iVar1 = -0x16;
      error_code = -0x16;
    }
    arkProcessError(local_38,error_code,"ARKode::ERKStep","ERKStepReInit",msgfmt);
  }
  return iVar1;
}

Assistant:

int ERKStepReInit(void* arkode_mem, ARKRhsFn f, realtype t0, N_Vector y0)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepReInit",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode::ERKStep",
                    "ERKStepReInit", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }

  /* Check that f is supplied */
  if (f == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep",
                    "ERKStepReInit", MSG_ARK_NULL_F);
    return(ARK_ILL_INPUT);
  }

  /* Check for legal input parameters */
  if (y0 == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep",
                    "ERKStepReInit", MSG_ARK_NULL_Y0);
    return(ARK_ILL_INPUT);
  }

  /* Copy the input parameters into ARKode state */
  step_mem->f = f;

  /* Initialize main ARKode infrastructure */
  retval = arkInit(arkode_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::ERKStep", "ERKStepReInit",
                    "Unable to initialize main ARKode infrastructure");
    return(retval);
  }

  /* Initialize all the counters */
  step_mem->nfe = 0;

  return(ARK_SUCCESS);
}